

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uavs3d.c
# Opt level: O2

int uavs3d_flush(void *h,uavs3d_io_frm_t *frm_out)

{
  int iVar1;
  com_pic_t *pic;
  com_frm_t *frm;
  
  if (h != (void *)0x0) {
    while (*(int *)((long)h + 0x175c) != *(int *)((long)h + 0x1760)) {
      frm = (com_frm_t *)((long)*(int *)((long)h + 0x175c) * 0x1ff0 + *(long *)((long)h + 0x1768));
      pic = (com_pic_t *)uavs3d_threadpool_wait(*(threadpool_t **)((long)h + 0x17d0),frm);
      if (pic != (com_pic_t *)0x0) {
        *(int *)((long)h + 0x175c) = (*(int *)((long)h + 0x175c) + 1) % *(int *)((long)h + 0x1758);
        clean_ref_cnt(frm);
        if ((*(int *)((long)h + 0x174c) != 0) && ((frm->pichdr).pic_md5_exist != '\0')) {
          dec_check_pic_md5(pic,(frm->pichdr).pic_md5);
        }
        *(int *)((long)h + 0x17cc) = *(int *)((long)h + 0x17cc) + 1;
      }
    }
  }
  iVar1 = uavs3d_output_frame(h,frm_out,1,*(uavs3d_lib_output_callback_t *)((long)h + 0x17e0));
  return iVar1;
}

Assistant:

int __cdecl uavs3d_flush(void *h, uavs3d_io_frm_t* frm_out)
{
    uavs3d_dec_t *ctx = h;
    int ret = 0;

    if (ctx) {
        while (ctx->frm_node_start != ctx->frm_node_end) {
            com_frm_t *frm = &ctx->frm_nodes_list[ctx->frm_node_start];
            com_pic_t *pic = uavs3d_threadpool_wait(ctx->frm_threads_pool, frm);

            if (pic) {
                ctx->frm_node_start = (ctx->frm_node_start + 1) % ctx->frm_nodes;

                clean_ref_cnt(frm);

                if (ctx->dec_cfg.check_md5 && frm->pichdr.pic_md5_exist) {
                    dec_check_pic_md5(pic, frm->pichdr.pic_md5);
                }
                ctx->output++;
            }
        }
    }
    
    ret = uavs3d_output_frame(ctx, frm_out, 1, ctx->callback);

    return ret;
}